

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

void toml::detail::
     throw_bad_cast<(toml::value_t)9,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (string *funcname,value_t actual,
               basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  type_error *this;
  char (*args_1) [13];
  value_t *in_R8;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  value_t local_1d3;
  allocator_type local_1d2;
  char local_1d1;
  string local_1d0;
  source_location local_1b0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  string local_148;
  string local_128;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  source_location local_78;
  
  local_1d3 = actual;
  this = (type_error *)__cxa_allocate_exception(0x78);
  args_1 = (char (*) [13])&local_1d1;
  local_1d1 = '\t';
  concat_to_string<std::__cxx11::string_const&,char_const(&)[13],toml::value_t>
            (&local_148,(toml *)funcname,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"bad_cast to ",
             args_1,in_R8);
  source_location::source_location
            (&local_1b0,
             (v->region_info_).
             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  concat_to_string<char_const(&)[20],toml::value_t&>
            (&local_1d0,(toml *)"the actual type is ",(char (*) [20])&local_1d3,(value_t *)args_1);
  paVar1 = &local_1b0.file_name_.field_2;
  local_108.first.file_name_._M_dataplus._M_p = (pointer)&local_108.first.file_name_.field_2;
  local_108.first.region_size_ = local_1b0.region_size_;
  local_108.first.line_num_ = local_1b0.line_num_;
  local_108.first.column_num_ = local_1b0.column_num_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.file_name_._M_dataplus._M_p == paVar1) {
    local_108.first.file_name_.field_2._8_8_ = local_1b0.file_name_.field_2._8_8_;
  }
  else {
    local_108.first.file_name_._M_dataplus._M_p = local_1b0.file_name_._M_dataplus._M_p;
  }
  paVar2 = &local_1b0.line_str_.field_2;
  local_108.first.line_str_._M_dataplus._M_p = (pointer)&local_108.first.line_str_.field_2;
  local_108.first.file_name_._M_string_length = local_1b0.file_name_._M_string_length;
  local_1b0.file_name_._M_string_length = 0;
  local_1b0.file_name_.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.line_str_._M_dataplus._M_p == paVar2) {
    local_108.first.line_str_.field_2._8_8_ = local_1b0.line_str_.field_2._8_8_;
  }
  else {
    local_108.first.line_str_._M_dataplus._M_p = local_1b0.line_str_._M_dataplus._M_p;
  }
  local_108.second._M_dataplus._M_p = (pointer)&local_108.second.field_2;
  local_108.first.line_str_._M_string_length = local_1b0.line_str_._M_string_length;
  local_1b0.line_str_._M_string_length = 0;
  local_1b0.line_str_.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
    local_108.second.field_2._8_8_ = local_1d0.field_2._8_8_;
  }
  else {
    local_108.second._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
  }
  local_108.second._M_string_length = local_1d0._M_string_length;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  __l._M_len = 1;
  __l._M_array = &local_108;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1b0.file_name_._M_dataplus._M_p = (pointer)paVar1;
  local_1b0.line_str_._M_dataplus._M_p = (pointer)paVar2;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_160,__l,&local_1d2);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_underline(&local_128,&local_148,&local_160,&local_98,false);
  source_location::source_location
            (&local_78,
             (v->region_info_).
             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  type_error::type_error(this,&local_128,&local_78);
  __cxa_throw(this,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]] inline void
throw_bad_cast(const std::string& funcname, value_t actual, const Value& v)
{
    throw type_error(detail::format_underline(
        concat_to_string(funcname, "bad_cast to ", Expected), {
            {v.location(), concat_to_string("the actual type is ", actual)}
        }), v.location());
}